

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O2

EventLoop * __thiscall higan::EventLoopThreadPool::GetNextEventLoop(EventLoopThreadPool *this)

{
  pointer ppEVar1;
  EventLoop *pEVar2;
  Logger local_328;
  Fmt local_110;
  
  if (this->running_ == false) {
    Logger::Logger(&local_328,FATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/EventLoopThreadPool.cpp"
                   ,0x2e,"GetNextEventLoop");
    Fmt::Fmt(&local_110,"EventLoopThreadPool %s hadn\'t started",(this->name_)._M_dataplus._M_p);
    Logger::operator<<(&local_328,&local_110);
    Logger::~Logger(&local_328);
  }
  ppEVar1 = (this->event_loops_).
            super__Vector_base<higan::EventLoop_*,_std::allocator<higan::EventLoop_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)this->thread_num_ == 0) {
    pEVar2 = *ppEVar1;
  }
  else {
    pEVar2 = ppEVar1[GetNextEventLoop::event_loop_sub];
    GetNextEventLoop::event_loop_sub =
         GetNextEventLoop::event_loop_sub % (ulong)(long)this->thread_num_ + 1;
  }
  return pEVar2;
}

Assistant:

EventLoop* EventLoopThreadPool::GetNextEventLoop()
{
	if (!running_)
	{
		LOG_FATAL << higan::Fmt("EventLoopThreadPool %s hadn't started", name_.c_str());
	}

	EventLoop* result = event_loops_[0];

	if (thread_num_ != 0)
	{
		static size_t event_loop_sub = 1;
		result = event_loops_[event_loop_sub];

		event_loop_sub = event_loop_sub % thread_num_ + 1;
	}

	return result;
}